

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib-flate.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  ostream *poVar5;
  ostream *poVar6;
  string *psVar7;
  char *pcVar8;
  char *pcVar9;
  bool warn;
  action_e action;
  shared_ptr<Pl_Flate> flate;
  shared_ptr<Pl_StdioFile> out;
  uchar buf [10000];
  char local_2781;
  action_e local_2780;
  undefined1 local_2779;
  Pl_Flate *local_2778;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2770;
  Pl_StdioFile *local_2768;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2760;
  char *local_2758;
  undefined8 local_2750;
  code *local_2748;
  code *local_2740;
  Pl_StdioFile *local_2738 [1251];
  
  pcVar8 = *argv;
  pcVar3 = strrchr(pcVar8,0x2f);
  pcVar9 = pcVar3 + 1;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = pcVar8;
  }
  whoami = pcVar9;
  if (argc == 2) {
    pcVar8 = argv[1];
    iVar2 = strcmp(pcVar8,"--version");
    if (iVar2 == 0) goto LAB_0010369b;
    local_2780 = a_inflate;
    iVar2 = strcmp(pcVar8,"-uncompress");
    if (iVar2 == 0) {
LAB_00103562:
      local_2781 = '\0';
      QUtil::binary_stdout();
      QUtil::binary_stdin();
      Pl_Flate::zopfli_check_env((QPDFLogger *)0x0);
      local_2768 = (Pl_StdioFile *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Pl_StdioFile,std::allocator<Pl_StdioFile>,char_const(&)[7],_IO_FILE*&>
                (&local_2760,&local_2768,(allocator<Pl_StdioFile> *)local_2738,
                 (char (*) [7])"stdout",(_IO_FILE **)&stdout);
      local_2738[0] = local_2768;
      local_2778 = (Pl_Flate *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Pl_Flate,std::allocator<Pl_Flate>,char_const(&)[6],Pl_StdioFile*,Pl_Flate::action_e&>
                (&local_2770,&local_2778,(allocator<Pl_Flate> *)&local_2779,(char (*) [6])"flate",
                 local_2738,&local_2780);
      local_2750 = 0;
      local_2758 = &local_2781;
      local_2740 = std::
                   _Function_handler<void_(const_char_*,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/zlib-flate/zlib-flate.cc:69:32)>
                   ::_M_invoke;
      local_2748 = std::
                   _Function_handler<void_(const_char_*,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/zlib-flate/zlib-flate.cc:69:32)>
                   ::_M_manager;
      Pl_Flate::setWarnCallback(local_2778);
      if (local_2748 != (code *)0x0) {
        (*local_2748)(&local_2758,&local_2758,3);
      }
      while( true ) {
        sVar4 = fread(local_2738,1,10000,_stdin);
        if (sVar4 == 0) break;
        (**(code **)(*(long *)local_2778 + 0x10))(local_2778,local_2738,sVar4);
      }
      (**(code **)(*(long *)local_2778 + 0x18))();
      if (local_2770._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2770._M_pi);
      }
      if (local_2760._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2760._M_pi);
      }
      if (local_2781 == '\0') {
        return 0;
      }
      exit(3);
    }
    iVar2 = strcmp(pcVar8,"-compress");
    if (iVar2 == 0) {
      local_2780 = a_deflate;
      goto LAB_00103562;
    }
    iVar2 = strncmp(pcVar8,"-compress=",10);
    if (iVar2 == 0) {
      local_2780 = a_deflate;
      iVar2 = QUtil::string_to_int(pcVar8 + 10);
      Pl_Flate::setCompressionLevel(iVar2);
      goto LAB_00103562;
    }
    iVar2 = strcmp(pcVar8,"--_zopfli");
    if (iVar2 == 0) {
      cVar1 = Pl_Flate::zopfli_supported();
      pcVar9 = "0";
      pcVar8 = "0";
      if (cVar1 != '\0') {
        pcVar8 = "1";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,1);
      cVar1 = Pl_Flate::zopfli_enabled();
      if (cVar1 != '\0') {
        pcVar9 = "1";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,1);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      return 0;
    }
  }
  usage();
LAB_0010369b:
  poVar5 = std::operator<<((ostream *)&std::cout,pcVar9);
  poVar6 = std::operator<<(poVar5," from qpdf version ");
  psVar7 = (string *)QPDF::QPDFVersion_abi_cxx11_((QPDF *)poVar5);
  poVar5 = std::operator<<(poVar6,psVar7);
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(0);
}

Assistant:

int
main(int argc, char* argv[])
{
    if ((whoami = strrchr(argv[0], '/')) == nullptr) {
        whoami = argv[0];
    } else {
        ++whoami;
    }

    if ((argc == 2) && (strcmp(argv[1], "--version") == 0)) {
        std::cout << whoami << " from qpdf version " << QPDF::QPDFVersion() << std::endl;
        exit(0);
    }

    if (argc != 2) {
        usage();
    }

    Pl_Flate::action_e action = Pl_Flate::a_inflate;

    if ((strcmp(argv[1], "-uncompress") == 0)) {
        // okay
    } else if ((strcmp(argv[1], "-compress") == 0)) {
        action = Pl_Flate::a_deflate;
    } else if ((strncmp(argv[1], "-compress=", 10) == 0)) {
        action = Pl_Flate::a_deflate;
        int level = QUtil::string_to_int(argv[1] + 10);
        Pl_Flate::setCompressionLevel(level);
    } else if (strcmp(argv[1], "--_zopfli") == 0) {
        // Undocumented option, but that doesn't mean someone doesn't use it...
        // This is primarily here to support the test suite.
        std::cout << (Pl_Flate::zopfli_supported() ? "1" : "0")
                  << (Pl_Flate::zopfli_enabled() ? "1" : "0") << std::endl;
        return 0;
    } else {
        usage();
    }

    bool warn = false;
    try {
        QUtil::binary_stdout();
        QUtil::binary_stdin();
        Pl_Flate::zopfli_check_env();
        auto out = std::make_shared<Pl_StdioFile>("stdout", stdout);
        auto flate = std::make_shared<Pl_Flate>("flate", out.get(), action);
        flate->setWarnCallback([&warn](char const* msg, int code) {
            warn = true;
            std::cerr << whoami << ": WARNING: zlib code " << code << ", msg = " << msg
                      << std::endl;
        });

        unsigned char buf[10000];
        bool done = false;
        while (!done) {
            size_t len = fread(buf, 1, sizeof(buf), stdin);
            if (len <= 0) {
                done = true;
            } else {
                flate->write(buf, len);
            }
        }
        flate->finish();
    } catch (std::exception& e) {
        std::cerr << whoami << ": " << e.what() << std::endl;
        exit(2);
    }

    if (warn) {
        exit(3);
    }
    return 0;
}